

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O1

istream * libDAI::operator>>(istream *is,FactorGraph *fg)

{
  byte bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var9;
  Exception *pEVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  pointer pVVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  size_t nr_members;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dims;
  vector<long,_std::allocator<long>_> labels;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vi;
  size_t nr_nonzeros;
  size_t nr_f;
  vector<long,_std::allocator<long>_> sigma;
  VarSet I_vars;
  string line;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> factors;
  vector<unsigned_long,_std::allocator<unsigned_long>_> svi;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sdims;
  double val;
  size_t li;
  multind smi;
  multind mi;
  ulong local_2b8;
  allocator_type local_2a9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2a8;
  undefined1 local_288 [16];
  long *local_278;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_268;
  ulong local_250;
  ulong local_248;
  vector<long,_std::allocator<long>_> local_240;
  undefined1 local_228 [16];
  pointer local_218;
  size_t local_210;
  undefined1 *local_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined7 uStack_1f7;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_1e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1b8;
  FactorGraph *local_1a0;
  ulong local_198;
  value_type_conflict2 local_190;
  double local_188;
  size_t local_180;
  multind local_178;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_130;
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  pointer local_f8;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_f0;
  pointer local_d8;
  pointer local_c8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_c0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_a8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_90;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_libDAI::TFactor<double>_>,_std::_Select1st<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
  local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_1e8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208 = &local_1f8;
  local_200 = 0;
  local_1f8 = 0;
  while( true ) {
    iVar8 = std::istream::peek();
    cVar6 = (char)is;
    if (iVar8 != 0x23) break;
    cVar6 = std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + cVar6);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&local_208,cVar6);
  }
  std::istream::_M_extract<unsigned_long>((ulong *)is);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
    pEVar10 = (Exception *)__cxa_allocate_exception(0x10);
    local_118._0_8_ = &local_108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,"factorgraph.cpp, line 111","");
    Exception::Exception(pEVar10,7,(string *)local_118);
    __cxa_throw(pEVar10,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar7 = std::ios::widen((char)*(long *)(*(long *)is + -0x18) + cVar6);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&local_208,cVar7);
  local_1a0 = fg;
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
    pEVar10 = (Exception *)__cxa_allocate_exception(0x10);
    local_118._0_8_ = &local_108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,"factorgraph.cpp, line 117","");
    Exception::Exception(pEVar10,7,(string *)local_118);
    __cxa_throw(pEVar10,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_248 != 0) {
    uVar14 = 0;
    do {
      while( true ) {
        iVar8 = std::istream::peek();
        if (iVar8 != 0x23) break;
        cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + cVar6);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  (is,(string *)&local_208,cVar7);
      }
      local_198 = uVar14;
      std::istream::_M_extract<unsigned_long>((ulong *)is);
      local_288 = (undefined1  [16])0x0;
      local_278 = (long *)0x0;
      if (local_2b8 != 0) {
        uVar14 = 0;
        do {
          while (iVar8 = std::istream::peek(), iVar8 == 0x23) {
            cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + cVar6);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      (is,(string *)&local_208,cVar7);
          }
          std::istream::_M_extract<long>((long *)is);
          if ((long *)local_288._8_8_ == local_278) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)local_288,(iterator)local_288._8_8_,
                       (long *)local_118);
          }
          else {
            *(undefined8 *)local_288._8_8_ = local_118._0_8_;
            local_288._8_8_ = (long *)(local_288._8_8_ + 8);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < local_2b8);
      }
      local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      if (local_2b8 != 0) {
        uVar14 = 0;
        do {
          while (iVar8 = std::istream::peek(), iVar8 == 0x23) {
            cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + cVar6);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      (is,(string *)&local_208,cVar7);
          }
          std::istream::_M_extract<unsigned_long>((ulong *)is);
          if (local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_2a8,
                       (iterator)
                       local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_118);
          }
          else {
            *local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_118._0_8_;
            local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < local_2b8);
      }
      local_228 = (undefined1  [16])0x0;
      local_218 = (pointer)0x0;
      local_210 = 1;
      if (local_2b8 != 0) {
        uVar14 = 0;
        do {
          local_118._0_8_ = *(unsigned_long *)(local_288._0_8_ + uVar14 * 8);
          local_118._8_8_ =
               local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14];
          VarSet::operator|=((VarSet *)local_228,(Var *)local_118);
          uVar14 = uVar14 + 1;
        } while (uVar14 < local_2b8);
      }
      TFactor<double>::TFactor((TFactor<double> *)local_118,(VarSet *)local_228,0.0);
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                 &local_1e8,(TFactor<double> *)local_118);
      if (local_f8 != (pointer)0x0) {
        operator_delete(local_f8,(long)local_f0.
                                       super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)local_f8);
      }
      if ((pointer)local_118._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity - local_118._0_8_);
      }
      local_118._0_8_ = (pointer)0x0;
      std::vector<long,_std::allocator<long>_>::vector
                (&local_240,local_2b8,(value_type_conflict5 *)local_118,(allocator_type *)&local_178
                );
      if (local_2b8 != 0) {
        uVar14 = 0;
        pVVar15 = (pointer)local_228._0_8_;
        do {
          local_118._0_8_ = pVVar15->_label;
          _Var9 = std::
                  __find_if<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equals_val<long_const>>
                            (local_288._0_8_,local_288._8_8_,(TFactor<double> *)local_118);
          local_240.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar14] = (long)_Var9._M_current - local_288._0_8_ >> 3;
          uVar14 = uVar14 + 1;
          pVVar15 = pVVar15 + 1;
        } while (uVar14 < local_2b8);
      }
      local_118._0_8_ = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_1b8,local_2b8,(value_type_conflict2 *)local_118,(allocator_type *)&local_178
                );
      if (local_2b8 != 0) {
        uVar14 = 0;
        do {
          local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14] =
               local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start
               [local_240.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14]];
          uVar14 = uVar14 + 1;
        } while (uVar14 < local_2b8);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_130,&local_2a8);
      multind::multind((multind *)local_118,&local_130);
      if (local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_130.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_130.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_148,&local_1b8);
      multind::multind(&local_178,&local_148);
      if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_148.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      while (iVar8 = std::istream::peek(), iVar8 == 0x23) {
        cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + cVar6);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  (is,(string *)&local_208,cVar7);
      }
      std::istream::_M_extract<unsigned_long>((ulong *)is);
      if (local_250 != 0) {
        uVar14 = 0;
        do {
          while (iVar8 = std::istream::peek(), iVar8 == 0x23) {
            cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + cVar6);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      (is,(string *)&local_208,cVar7);
          }
          std::istream::_M_extract<unsigned_long>((ulong *)is);
          while (iVar8 = std::istream::peek(), iVar8 == 0x23) {
            cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + cVar6);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      (is,(string *)&local_208,cVar7);
          }
          std::istream::_M_extract<double>((double *)is);
          multind::vi(&local_268,(multind *)local_118,local_180);
          local_190 = 0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_1d0,
                     (long)local_268.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_268.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3,&local_190,&local_2a9);
          if ((long)local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0) {
            lVar11 = (long)local_268.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_268.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
            lVar13 = 0;
            do {
              local_1d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13] =
                   local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [local_240.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13]];
              lVar13 = lVar13 + 1;
            } while (lVar11 + (ulong)(lVar11 == 0) != lVar13);
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,&local_1d0);
          if ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start == 0) {
            lVar11 = 0;
          }
          else {
            lVar11 = (long)local_48.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_48.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
            auVar17 = vpbroadcastq_avx512f();
            auVar22 = ZEXT1664((undefined1  [16])0x0);
            uVar12 = 0;
            auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            do {
              auVar19 = vmovdqa64_avx512f(auVar22);
              auVar22 = vpbroadcastq_avx512f();
              auVar22 = vporq_avx512f(auVar22,auVar18);
              uVar5 = vpcmpuq_avx512f(auVar22,auVar17,2);
              auVar22 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                           (local_48.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar12));
              bVar1 = (byte)uVar5;
              auVar20._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar22._8_8_;
              auVar20._0_8_ = (ulong)(bVar1 & 1) * auVar22._0_8_;
              auVar20._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar22._16_8_;
              auVar20._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar22._24_8_;
              auVar20._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar22._32_8_;
              auVar20._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar22._40_8_;
              auVar20._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar22._48_8_;
              auVar20._56_8_ = (uVar5 >> 7) * auVar22._56_8_;
              auVar22 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                           (local_178._pdims.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar12));
              auVar21._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar22._8_8_;
              auVar21._0_8_ = (ulong)(bVar1 & 1) * auVar22._0_8_;
              auVar21._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar22._16_8_;
              auVar21._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar22._24_8_;
              auVar21._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar22._32_8_;
              auVar21._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar22._40_8_;
              auVar21._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar22._48_8_;
              auVar21._56_8_ = (uVar5 >> 7) * auVar22._56_8_;
              auVar22 = vpmullq_avx512dq(auVar21,auVar20);
              auVar22 = vpaddq_avx512f(auVar22,auVar19);
              uVar12 = uVar12 + 8;
            } while ((lVar11 + (ulong)(lVar11 == 0) + 7 & 0xfffffffffffffff8) != uVar12);
            auVar17 = vmovdqa64_avx512f(auVar22);
            auVar18._0_8_ =
                 (ulong)(bVar1 & 1) * auVar17._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar19._0_8_;
            bVar2 = (bool)((byte)(uVar5 >> 1) & 1);
            auVar18._8_8_ = (ulong)bVar2 * auVar17._8_8_ | (ulong)!bVar2 * auVar19._8_8_;
            bVar2 = (bool)((byte)(uVar5 >> 2) & 1);
            auVar18._16_8_ = (ulong)bVar2 * auVar17._16_8_ | (ulong)!bVar2 * auVar19._16_8_;
            bVar2 = (bool)((byte)(uVar5 >> 3) & 1);
            auVar18._24_8_ = (ulong)bVar2 * auVar17._24_8_ | (ulong)!bVar2 * auVar19._24_8_;
            bVar2 = (bool)((byte)(uVar5 >> 4) & 1);
            auVar18._32_8_ = (ulong)bVar2 * auVar17._32_8_ | (ulong)!bVar2 * auVar19._32_8_;
            bVar2 = (bool)((byte)(uVar5 >> 5) & 1);
            auVar18._40_8_ = (ulong)bVar2 * auVar17._40_8_ | (ulong)!bVar2 * auVar19._40_8_;
            bVar2 = (bool)((byte)(uVar5 >> 6) & 1);
            auVar18._48_8_ = (ulong)bVar2 * auVar17._48_8_ | (ulong)!bVar2 * auVar19._48_8_;
            auVar18._56_8_ =
                 (uVar5 >> 7) * auVar17._56_8_ | (ulong)!SUB81(uVar5 >> 7,0) * auVar19._56_8_;
            auVar16 = vextracti64x4_avx512f(auVar18,1);
            auVar17 = vpaddq_avx512f(auVar18,ZEXT3264(auVar16));
            auVar3 = vpaddq_avx(auVar17._0_16_,auVar17._16_16_);
            auVar4 = vpshufd_avx(auVar3,0xee);
            auVar3 = vpaddq_avx(auVar3,auVar4);
            lVar11 = auVar3._0_8_;
          }
          if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_1e8.
          super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1]._p._p.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar11] = local_188;
          if (local_1d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1d0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1d0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1d0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_268.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_268.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_268.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < local_250);
      }
      if (local_178._pdims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_178._pdims.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_178._pdims.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_178._pdims.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar14 = local_198;
      if (local_178._dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_178._dims.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_178._dims.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_178._dims.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_108._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_108._8_8_,
                        (long)local_f0.
                              super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - local_108._8_8_);
      }
      if ((pointer)local_118._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity - local_118._0_8_);
      }
      if (local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_240.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_240.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_240.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_240.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((pointer)local_228._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_228._0_8_,(long)local_218 - local_228._0_8_);
      }
      if (local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2a8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2a8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)local_288._0_8_ != (void *)0x0) {
        operator_delete((void *)local_288._0_8_,(long)local_278 - local_288._0_8_);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < local_248);
  }
  FactorGraph::FactorGraph((FactorGraph *)local_118,&local_1e8);
  FactorGraph::operator=(local_1a0,(FactorGraph *)local_118);
  local_118._0_8_ = &PTR__FactorGraph_005e7dd8;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_libDAI::TFactor<double>_>,_std::_Select1st<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
  ::~_Rb_tree(&local_78);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_90);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_c0);
  if (local_d8 != (pointer)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&local_f0);
  if ((pointer)local_108._M_allocated_capacity != (pointer)0x0) {
    operator_delete((void *)local_108._M_allocated_capacity,(long)local_f8 - local_108._0_8_);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&local_1e8);
  return is;
}

Assistant:

std::istream& operator >> (std::istream& is, FactorGraph& fg) {
        long verbose = 0;

        try {
            vector<Factor> factors;
            size_t nr_f;
            string line;
            
            while( (is.peek()) == '#' )
                getline(is,line);
            is >> nr_f;
            if( is.fail() )
                DAI_THROW(INVALID_FACTORGRAPH_FILE);
            if( verbose >= 2 )
                cout << "Reading " << nr_f << " factors..." << endl;

            getline (is,line);
            if( is.fail() )
                DAI_THROW(INVALID_FACTORGRAPH_FILE);

            for( size_t I = 0; I < nr_f; I++ ) {
                if( verbose >= 3 )
                    cout << "Reading factor " << I << "..." << endl;
                size_t nr_members;
                while( (is.peek()) == '#' )
                    getline(is,line);
                is >> nr_members;
                if( verbose >= 3 )
                    cout << "  nr_members: " << nr_members << endl;

                vector<long> labels;
                for( size_t mi = 0; mi < nr_members; mi++ ) {
                    long mi_label;
                    while( (is.peek()) == '#' )
                        getline(is,line);
                    is >> mi_label;
                    labels.push_back(mi_label);
                }
                if( verbose >= 3 ) {
                    cout << "  labels: ";
                    copy (labels.begin(), labels.end(), ostream_iterator<int>(cout, " "));
                    cout << endl;
                }

                vector<size_t> dims;
                for( size_t mi = 0; mi < nr_members; mi++ ) {
                    size_t mi_dim;
                    while( (is.peek()) == '#' )
                        getline(is,line);
                    is >> mi_dim;
                    dims.push_back(mi_dim);
                }
                if( verbose >= 3 ) {
                    cout << "  dimensions: ";
                    copy (dims.begin(), dims.end(), ostream_iterator<int>(cout, " "));
                    cout << endl;
                }

                // add the Factor
                VarSet I_vars;
                for( size_t mi = 0; mi < nr_members; mi++ )
                    I_vars |= Var(labels[mi], dims[mi]);
                factors.push_back(Factor(I_vars,0.0));
                
                // calculate permutation sigma (internally, members are sorted)
                vector<long> sigma(nr_members,0);
                VarSet::iterator j = I_vars.begin();
                for( size_t mi = 0; mi < nr_members; mi++,j++ ) {
                    long search_for = j->label();
                    vector<long>::iterator j_loc = find(labels.begin(),labels.end(),search_for);
                    sigma[mi] = j_loc - labels.begin();
                }
                if( verbose >= 3 ) {
                    cout << "  sigma: ";
                    copy( sigma.begin(), sigma.end(), ostream_iterator<int>(cout," "));
                    cout << endl;
                }

                // calculate multindices
                vector<size_t> sdims(nr_members,0);
                for( size_t k = 0; k < nr_members; k++ ) {
                    sdims[k] = dims[sigma[k]];
                }
                multind mi(dims);
                multind smi(sdims);
                if( verbose >= 3 ) {
                    cout << "  mi.max(): " << mi.max() << endl;
                    cout << "       ";
                    for( size_t k=0; k < nr_members; k++ ) 
                        cout << labels[k] << " ";
                    cout << "   ";
                    for( size_t k=0; k < nr_members; k++ ) 
                        cout << labels[sigma[k]] << " ";
                    cout << endl;
                }
                
                // read values
                size_t nr_nonzeros;
                while( (is.peek()) == '#' )
                    getline(is,line);
                is >> nr_nonzeros;
                if( verbose >= 3 ) 
                    cout << "  nonzeroes: " << nr_nonzeros << endl;
                for( size_t k = 0; k < nr_nonzeros; k++ ) {
                    size_t li;
                    double val;
                    while( (is.peek()) == '#' )
                        getline(is,line);
                    is >> li;
                    while( (is.peek()) == '#' )
                        getline(is,line);
                    is >> val;

                    vector<size_t> vi = mi.vi(li);
                    vector<size_t> svi(vi.size(),0);
                    for( size_t k = 0; k < vi.size(); k++ )
                        svi[k] = vi[sigma[k]];
                    size_t sli = smi.li(svi);
                    if( verbose >= 3 ) {
                        cout << "    " << li << ": ";
                        copy( vi.begin(), vi.end(), ostream_iterator<size_t>(cout," "));
                        cout << "-> ";
                        copy( svi.begin(), svi.end(), ostream_iterator<size_t>(cout," "));
                        cout << ": " << sli << endl;
                    }
                    factors.back()[sli] = val;
                }
            }

            if( verbose >= 3 ) {
                cout << "factors:" << endl;
                copy(factors.begin(), factors.end(), ostream_iterator<Factor>(cout,"\n"));
            }

            fg = FactorGraph(factors);
        } catch (char *e) {
            cout << e << endl;
        }

        return is;
    }